

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::SyncWritePattern(SscWriterGeneric *this,bool finalStep)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Buffer localBuffer;
  Buffer globalBuffer;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Engine","");
  localBuffer.m_Capacity = (size_t)&localBuffer.m_Buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&localBuffer,"SscWriter","");
  globalBuffer.m_Capacity = (size_t)&globalBuffer.m_Buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&globalBuffer,"SyncWritePattern","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  iVar3 = (this->super_SscWriterBase).m_WriterRank;
  iVar2 = (this->super_SscWriterBase).m_Verbosity;
  iVar4 = 0;
  if (9 < iVar2) {
    iVar4 = iVar3;
  }
  adios2::helper::Log((string *)&local_70,(string *)&localBuffer,(string *)&globalBuffer,
                      (string *)local_50,iVar4,iVar3,5,iVar2,INFO);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((uint8_t **)globalBuffer.m_Capacity != &globalBuffer.m_Buffer) {
    operator_delete((void *)globalBuffer.m_Capacity);
  }
  if ((uint8_t **)localBuffer.m_Capacity != &localBuffer.m_Buffer) {
    operator_delete((void *)localBuffer.m_Capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  localBuffer.m_Buffer = (uint8_t *)malloc(8);
  localBuffer.m_Capacity = 8;
  localBuffer.m_Size = 0;
  localBuffer.m_Buffer[0] = '\b';
  localBuffer.m_Buffer[1] = '\0';
  localBuffer.m_Buffer[2] = '\0';
  localBuffer.m_Buffer[3] = '\0';
  localBuffer.m_Buffer[4] = '\0';
  localBuffer.m_Buffer[5] = '\0';
  localBuffer.m_Buffer[6] = '\0';
  localBuffer.m_Buffer[7] = '\0';
  iVar3 = (this->super_SscWriterBase).m_WriterRank;
  if (iVar3 == 0) {
    SerializeStructDefinitions
              ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
                *)(*(long *)(this->super_SscWriterBase).m_IO + 0x20),&localBuffer);
    iVar3 = (this->super_SscWriterBase).m_WriterRank;
  }
  if (iVar3 == (this->super_SscWriterBase).m_WriterSize + -1) {
    SerializeAttributes((this->super_SscWriterBase).m_IO,&localBuffer);
  }
  iVar3 = (this->super_SscWriterBase).m_StreamRank;
  SerializeVariables((this->m_GlobalWritePattern).
                     super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar3,&localBuffer,iVar3);
  globalBuffer.m_Buffer = (uint8_t *)malloc(1);
  globalBuffer.m_Capacity = 1;
  globalBuffer.m_Size = 0;
  AggregateMetadata(&localBuffer,&globalBuffer,(this->super_SscWriterBase).m_WriterComm,finalStep,
                    this->m_WriterDefinitionsLocked);
  BroadcastMetadata(&globalBuffer,(this->super_SscWriterBase).m_WriterMasterStreamRank,
                    (this->super_SscWriterBase).m_StreamComm);
  Deserialize(&globalBuffer,&this->m_GlobalWritePattern,(this->super_SscWriterBase).m_IO,false,false
              ,false,&this->m_StructDefinitions);
  if ((0x13 < (this->super_SscWriterBase).m_Verbosity) &&
     ((this->super_SscWriterBase).m_WriterRank == 0)) {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Global Write Pattern","");
    PrintBlockVecVec(&this->m_GlobalWritePattern,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  if (globalBuffer.m_Buffer != (uint8_t *)0x0) {
    free(globalBuffer.m_Buffer);
  }
  if (localBuffer.m_Buffer != (uint8_t *)0x0) {
    free(localBuffer.m_Buffer);
  }
  return;
}

Assistant:

void SscWriterGeneric::SyncWritePattern(bool finalStep)
{

    helper::Log("Engine", "SscWriter", "SyncWritePattern", "", m_Verbosity >= 10 ? m_WriterRank : 0,
                m_WriterRank, 5, m_Verbosity, helper::LogMode::INFO);

    ssc::Buffer localBuffer(8);
    localBuffer.value<uint64_t>() = 8;

    if (m_WriterRank == 0)
    {
        ssc::SerializeStructDefinitions(m_IO.m_ADIOS.m_StructDefinitions, localBuffer);
    }

    if (m_WriterRank == m_WriterSize - 1)
    {
        ssc::SerializeAttributes(m_IO, localBuffer);
    }

    ssc::SerializeVariables(m_GlobalWritePattern[m_StreamRank], localBuffer, m_StreamRank);

    ssc::Buffer globalBuffer;

    ssc::AggregateMetadata(localBuffer, globalBuffer, m_WriterComm, finalStep,
                           m_WriterDefinitionsLocked);

    ssc::BroadcastMetadata(globalBuffer, m_WriterMasterStreamRank, m_StreamComm);

    ssc::Deserialize(globalBuffer, m_GlobalWritePattern, m_IO, false, false, false,
                     m_StructDefinitions);

    if (m_Verbosity >= 20 && m_WriterRank == 0)
    {
        ssc::PrintBlockVecVec(m_GlobalWritePattern, "Global Write Pattern");
    }
}